

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

void QtPrivate::QStringList_replaceInStrings
               (QStringList *that,QStringView before,QStringView after,CaseSensitivity cs)

{
  ulong uVar1;
  qsizetype qVar2;
  pointer pQVar3;
  qsizetype *pqVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  QStringView haystack0;
  
  uVar1 = (that->d).size;
  uVar6 = 0xffffffffffffffff;
  if (uVar1 != 0) {
    pqVar4 = &(((that->d).ptr)->d).size;
    uVar7 = 0;
    do {
      haystack0.m_data = (char16_t *)pqVar4[-1];
      haystack0.m_size = *pqVar4;
      qVar2 = findString(haystack0,0,before,cs);
      uVar6 = uVar7;
      if (qVar2 != -1) break;
      uVar7 = uVar7 + 1;
      pqVar4 = pqVar4 + 3;
      uVar6 = 0xffffffffffffffff;
    } while (uVar1 != uVar7);
  }
  if ((uVar6 != 0xffffffffffffffff) && ((long)uVar6 < (that->d).size)) {
    lVar5 = uVar6 * 0x18;
    do {
      pQVar3 = QList<QString>::data(that);
      QString::replace((QString *)((long)&(pQVar3->d).d + lVar5),(QChar *)before.m_data,
                       before.m_size,(QChar *)after.m_data,after.m_size,cs);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < (ulong)(that->d).size);
  }
  return;
}

Assistant:

void QtPrivate::QStringList_replaceInStrings(QStringList *that, QStringView before,
                                             QStringView after, Qt::CaseSensitivity cs)
{
    // Before potentially detaching "that" list, check if any string contains "before"
    qsizetype i = -1;
    for (qsizetype j = 0; j < that->size(); ++j) {
        if (that->at(j).contains(before, cs)) {
            i = j;
            break;
        }
    }
    if (i == -1)
        return;

    for (; i < that->size(); ++i)
        (*that)[i].replace(before.data(), before.size(), after.data(), after.size(), cs);
}